

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O0

int menu_item_left_offset_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *in_value;
  Am_Object local_28;
  Am_Object local_20;
  byte local_15;
  Am_Widget_Look local_14;
  bool menuBarItem;
  Am_Object *pAStack_10;
  Am_Widget_Look look;
  Am_Object *self_local;
  
  pAStack_10 = self;
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_14,in_value);
  local_15 = 0;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)pAStack_10);
  Am_Object::Am_Object(&local_28,&Am_Menu_Bar);
  bVar1 = Am_Object::Is_Instance_Of(&local_20,&local_28);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    local_15 = 1;
  }
  iVar2 = menu_item_left_offset_internal(&local_14,(bool)(local_15 & 1));
  return iVar2;
}

Assistant:

Am_Define_Formula(int, menu_item_left_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  bool menuBarItem = false;
  if (self.Get_Owner().Is_Instance_Of(Am_Menu_Bar))
    // is this item in the menu bar
    menuBarItem = true;
  return menu_item_left_offset_internal(look, menuBarItem);
}